

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_image.cpp
# Opt level: O0

void Bitmap_Operation::Load(string *path,Image *raw)

{
  string *in_stack_00000468;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffffa8;
  ImageTemplate<unsigned_char> *this;
  ImageTemplate<unsigned_char> local_38;
  
  this = &local_38;
  Load(in_stack_00000468);
  PenguinV_Image::ImageTemplate<unsigned_char>::operator=(this,in_stack_ffffffffffffffa8);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x109dcd);
  return;
}

Assistant:

void Load( const std::string & path, PenguinV_Image::Image & raw )
    {
        raw = Load( path );
    }